

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cpp
# Opt level: O3

void Int2StrConvert<unsigned_short>(void)

{
  char cVar1;
  uint uVar2;
  char cVar3;
  long lVar4;
  size_t sVar5;
  ulong uVar6;
  long lVar7;
  ostream *poVar8;
  byte bVar9;
  ulong uVar10;
  char cVar11;
  char *pcVar12;
  unsigned_short i;
  ulong x;
  byte local_78;
  char local_77;
  char local_76;
  char local_75 [5];
  char buf [64];
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[",1);
  pcVar12 = _endl<char,std::char_traits<char>> + (*_endl<char,std::char_traits<char>> == '*');
  sVar5 = strlen(pcVar12);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar12,sVar5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"] ",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"int2str::convert",0x10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"... ",4);
  std::ostream::flush();
  buf._56_8_ = std::chrono::_V2::steady_clock::now();
  cVar11 = '0';
  x = 0;
  do {
    uVar10 = (x & 0xff) / 100;
    if (x < 0x100) {
      bVar9 = (byte)x;
      uVar2 = (uint)x;
      if (x < 100) {
        if (x < 10) {
          pcVar12 = &local_77;
        }
        else {
          local_77 = cVar11 + ((byte)((uVar2 & 0xff) / 5) & 0xfe) * -5;
          bVar9 = (byte)((uVar2 & 0xff) / 10);
          pcVar12 = &local_76;
        }
        local_78 = bVar9 | 0x30;
      }
      else {
        cVar1 = (char)((uVar2 & 0xff) * 0x29 >> 0xc);
        local_78 = cVar1 + 0x30;
        uVar6 = uVar10 * -100 + x;
        if (uVar6 < 10) {
          local_76 = (char)uVar10 * -100 + '0' + bVar9;
          local_77 = '0';
        }
        else {
          cVar3 = (char)(uVar6 / 10);
          local_77 = cVar3 + '0';
          local_76 = cVar1 * -100 + bVar9 + cVar3 * -10 + '0';
        }
        pcVar12 = local_75;
      }
    }
    else {
      pcVar12 = int2str::impl::detail<10000ull>::convert<char*>(x,(char *)&local_78);
    }
    *pcVar12 = '\0';
    x = x + 1;
    cVar11 = cVar11 + '\x01';
  } while (x != 0xffff);
  lVar7 = std::chrono::_V2::steady_clock::now();
  lVar4 = std::cout;
  *(uint *)(std::locale::classic + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::locale::classic + *(long *)(std::cout + -0x18)) & 0xfffffefb | 4;
  *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar4 + -0x18)) = 3;
  poVar8 = std::ostream::_M_insert<double>((double)(lVar7 - buf._56_8_) / 1000000000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"s",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  return;
}

Assistant:

void Int2StrConvert()
{
#ifdef _MSC_VER  
    static char buf[64];
#else
    char buf[64];
#endif
    PROFILING_BEGIN(T, "int2str::convert")
    int2str::convert_with_zero(i, buf);
    PROFILING_END()
}